

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnFunction
          (BinaryReaderInterp *this,Index index,Index sig_index)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  FuncType *__x;
  undefined1 auStack_d8 [64];
  pointer pLStack_98;
  undefined4 uStack_90;
  undefined4 local_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  Var local_70;
  
  auStack_d8._16_4_ = 0;
  auStack_d8._20_8_ = 0;
  auStack_d8._0_8_ = (_func_int **)0x0;
  auStack_d8._8_4_ = First;
  auStack_d8._12_4_ = 0;
  Var::Var(&local_70,sig_index,(Location *)auStack_d8);
  RVar2 = SharedValidator::OnFunction
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_70);
  Var::~Var(&local_70);
  if (RVar2.enum_ != Error) {
    pMVar1 = this->module_;
    __x = (pMVar1->func_types).
          super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
          _M_impl.super__Vector_impl_data._M_start + sig_index;
    FuncType::FuncType((FuncType *)auStack_d8,__x);
    uStack_88 = 0;
    uStack_84 = 0;
    pLStack_98 = (pointer)0x0;
    uStack_90 = 0;
    local_8c = 0;
    std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::
    emplace_back<wabt::interp::FuncDesc>(&pMVar1->funcs,(FuncDesc *)auStack_d8);
    FuncDesc::~FuncDesc((FuncDesc *)auStack_d8);
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::push_back
              (&this->func_types_,__x);
  }
  return (Result)(uint)(RVar2.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnFunction(Index index, Index sig_index) {
  CHECK_RESULT(validator_.OnFunction(loc, Var(sig_index)));
  FuncType& func_type = module_.func_types[sig_index];
  module_.funcs.push_back(FuncDesc{func_type, {}, 0});
  func_types_.push_back(func_type);
  return Result::Ok;
}